

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterDenseDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol,int start,int incr)

{
  uint *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  undefined8 uVar4;
  type_conflict5 tVar5;
  long lVar6;
  DataKey DVar7;
  long lVar8;
  long lVar9;
  undefined4 in_register_00000084;
  long lVar10;
  int local_19c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_198;
  pointer local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  devexpr local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar3 = (pSVar2->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_158 = (pSVar2->coWeights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(pSVar2->coWeights).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)local_158;
  local_198.m_backend.fpclass = cpp_dec_float_finite;
  local_198.m_backend.prec_elem = 10;
  local_198.m_backend.data._M_elems[0] = 0;
  local_198.m_backend.data._M_elems[1] = 0;
  local_198.m_backend.data._M_elems[2] = 0;
  local_198.m_backend.data._M_elems[3] = 0;
  local_198.m_backend.data._M_elems[4] = 0;
  local_198.m_backend.data._M_elems[5] = 0;
  local_198.m_backend.data._M_elems._24_5_ = 0;
  local_198.m_backend.data._M_elems[7]._1_3_ = 0;
  local_198.m_backend.data._M_elems._32_5_ = 0;
  local_198.m_backend.data._M_elems[9]._1_3_ = 0;
  local_198.m_backend.exp = 0;
  local_198.m_backend.neg = false;
  lVar10 = (long)start;
  lVar8 = (long)incr;
  lVar9 = lVar10 * 0x38;
  local_19c = -1;
  local_150 = best;
  while( true ) {
    if ((int)(lVar6 / 0x38) <= lVar10) break;
    uVar4 = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar9 + 0x20);
    local_198.m_backend.data._M_elems._32_5_ = SUB85(uVar4,0);
    local_198.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
    puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar9);
    local_198.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
    local_198.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar9 + 0x10);
    local_198.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar4 = *(undefined8 *)(puVar1 + 2);
    local_198.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
    local_198.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
    local_198.m_backend.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar9 + 0x28);
    local_198.m_backend.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar9 + 0x2c);
    local_198.m_backend._48_8_ = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar9 + 0x30);
    result.m_backend.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
    result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
    result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
    result.m_backend.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
    result.m_backend.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
    result.m_backend.exp = (feastol->m_backend).exp;
    result.m_backend.neg = (feastol->m_backend).neg;
    result.m_backend.fpclass = (feastol->m_backend).fpclass;
    result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    tVar5 = boost::multiprecision::operator<(&local_198,&result);
    if (tVar5) {
      uStack_50 = CONCAT35(local_198.m_backend.data._M_elems[7]._1_3_,
                           local_198.m_backend.data._M_elems._24_5_);
      local_68 = (devexpr  [8])local_198.m_backend.data._M_elems._0_8_;
      auStack_60[0] = local_198.m_backend.data._M_elems[2];
      auStack_60[1] = local_198.m_backend.data._M_elems[3];
      local_58[0] = local_198.m_backend.data._M_elems[4];
      local_58[1] = local_198.m_backend.data._M_elems[5];
      local_48 = CONCAT35(local_198.m_backend.data._M_elems[9]._1_3_,
                          local_198.m_backend.data._M_elems._32_5_);
      local_40 = local_198.m_backend.exp;
      local_3c = local_198.m_backend.neg;
      local_38 = local_198.m_backend.fpclass;
      iStack_34 = local_198.m_backend.prec_elem;
      puVar1 = (uint *)((long)&(local_158->m_backend).data + lVar9);
      local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
      local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(local_158->m_backend).data + lVar9 + 0x10);
      local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_a8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((long)&(local_158->m_backend).data + lVar9 + 0x20);
      local_a8.m_backend.exp = *(int *)((long)&(local_158->m_backend).data + lVar9 + 0x28);
      local_a8.m_backend.neg = *(bool *)((long)&(local_158->m_backend).data + lVar9 + 0x2c);
      local_a8.m_backend._48_8_ = *(undefined8 *)((long)&(local_158->m_backend).data + lVar9 + 0x30)
      ;
      local_e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      local_e8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
      local_e8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      local_e8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      local_e8.m_backend.exp = (feastol->m_backend).exp;
      local_e8.m_backend.neg = (feastol->m_backend).neg;
      local_e8.m_backend.fpclass = (feastol->m_backend).fpclass;
      local_e8.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      devexpr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&result,local_68,&local_a8,&local_e8,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_register_00000084,incr));
      local_198.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
      local_198.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
      local_198.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
      local_198.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
      local_198.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
      local_198.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
      local_198.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
      local_198.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
      local_198.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
      local_198.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
      local_198.m_backend.exp = result.m_backend.exp;
      local_198.m_backend.neg = result.m_backend.neg;
      local_198.m_backend.fpclass = result.m_backend.fpclass;
      local_198.m_backend.prec_elem = result.m_backend.prec_elem;
      tVar5 = boost::multiprecision::operator>(&local_198,local_150);
      if (tVar5) {
        *(ulong *)((local_150->m_backend).data._M_elems + 8) =
             CONCAT35(local_198.m_backend.data._M_elems[9]._1_3_,
                      local_198.m_backend.data._M_elems._32_5_);
        *(undefined8 *)((local_150->m_backend).data._M_elems + 4) =
             local_198.m_backend.data._M_elems._16_8_;
        *(ulong *)((local_150->m_backend).data._M_elems + 6) =
             CONCAT35(local_198.m_backend.data._M_elems[7]._1_3_,
                      local_198.m_backend.data._M_elems._24_5_);
        *(undefined8 *)(local_150->m_backend).data._M_elems =
             local_198.m_backend.data._M_elems._0_8_;
        *(undefined8 *)((local_150->m_backend).data._M_elems + 2) =
             local_198.m_backend.data._M_elems._8_8_;
        (local_150->m_backend).exp = local_198.m_backend.exp;
        (local_150->m_backend).neg = local_198.m_backend.neg;
        (local_150->m_backend).fpclass = local_198.m_backend.fpclass;
        (local_150->m_backend).prec_elem = local_198.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&(this->last).m_backend,
                   (cpp_dec_float<50U,_int,_void> *)((long)&(local_158->m_backend).data + lVar9));
        local_19c = (int)lVar10;
      }
    }
    lVar10 = lVar10 + lVar8;
    lVar9 = lVar9 + lVar8 * 0x38;
  }
  if (local_19c < 0) {
    DVar7.info = 0;
    DVar7.idx = -1;
  }
  else {
    DVar7 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::coId((this->
                            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).thesolver,local_19c);
  }
  return (SPxId)DVar7;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterDenseDim(R& best, R feastol, int start, int incr)
{
   const R* cTest = this->thesolver->coTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   int end = this->thesolver->coWeights.dim();
   int enterIdx = -1;
   R x;

   assert(end == this->thesolver->coTest().dim());

   for(; start < end; start += incr)
   {
      x = cTest[start];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[start], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = start;
            last = cpen[start];
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->coId(enterIdx);

   return SPxId();
}